

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentmap.h
# Opt level: O0

void quicly_sentmap_init_iter(quicly_sentmap_t *map,quicly_sentmap_iter_t *iter)

{
  long *in_RSI;
  long *in_RDI;
  
  in_RSI[2] = (long)in_RDI;
  if (*in_RDI == 0) {
    *in_RSI = (long)&quicly_sentmap__end_iter;
    in_RSI[1] = 0;
  }
  else {
    if (*(long *)(*in_RDI + 8) == 0) {
      __assert_fail("map->head->num_entries != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/sentmap.h"
                    ,0x12f,
                    "void quicly_sentmap_init_iter(quicly_sentmap_t *, quicly_sentmap_iter_t *)");
    }
    *in_RSI = *in_RDI + 0x18;
    while (*(long *)*in_RSI == 0) {
      *in_RSI = *in_RSI + 0x20;
    }
    if (*(code **)*in_RSI != quicly_sentmap__type_packet) {
      __assert_fail("iter->p->acked == quicly_sentmap__type_packet",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/sentmap.h"
                    ,0x132,
                    "void quicly_sentmap_init_iter(quicly_sentmap_t *, quicly_sentmap_iter_t *)");
    }
    in_RSI[1] = *(long *)(*in_RDI + 8);
  }
  return;
}

Assistant:

inline void quicly_sentmap_init_iter(quicly_sentmap_t *map, quicly_sentmap_iter_t *iter)
{
    /* set up the iterator */
    iter->ref = &map->head;
    if (map->head != NULL) {
        assert(map->head->num_entries != 0);
        for (iter->p = map->head->entries; iter->p->acked == NULL; ++iter->p)
            ;
        assert(iter->p->acked == quicly_sentmap__type_packet);
        iter->count = map->head->num_entries;
    } else {
        iter->p = (quicly_sent_t *)&quicly_sentmap__end_iter;
        iter->count = 0;
    }
}